

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SetBuilder.h
# Opt level: O0

void __thiscall Refal2::CSetBuilder<int>::Exclude(CSetBuilder<int> *this,int *element)

{
  undefined1 local_48 [8];
  CSet tmp;
  int *element_local;
  CSetBuilder<int> *this_local;
  
  tmp._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)element;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)local_48);
  std::set<int,_std::less<int>,_std::allocator<int>_>::insert
            ((set<int,_std::less<int>,_std::allocator<int>_> *)local_48,
             (value_type_conflict2 *)tmp._M_t._M_impl.super__Rb_tree_header._M_node_count);
  Exclude(this,(CSet *)local_48);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)local_48);
  return;
}

Assistant:

void CSetBuilder<T>::Exclude( const T& element )
{
	CSet tmp;
	tmp.insert( element );
	Exclude( tmp );
}